

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

monster_race * get_mon_race_aux(long total,alloc_entry *table)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  
  uVar2 = Rand_div((uint32_t)total);
  uVar6 = 0;
  uVar4 = alloc_race_size;
  if (alloc_race_size < 1) {
    uVar4 = 0;
  }
  lVar3 = (long)(int)uVar2;
  for (piVar7 = &table->prob3;
      (uVar5 = (ulong)uVar4, uVar4 != uVar6 && (iVar1 = *piVar7, uVar5 = uVar6, iVar1 <= lVar3));
      piVar7 = piVar7 + 5) {
    uVar6 = uVar6 + 1;
    lVar3 = lVar3 - iVar1;
  }
  return r_info + table[uVar5].index;
}

Assistant:

static struct monster_race *get_mon_race_aux(long total,
											 const alloc_entry *table)
{
	int i;

	/* Pick a monster */
	long value = randint0(total);

	/* Find the monster */
	for (i = 0; i < alloc_race_size; i++) {
		/* Found the entry */
		if (value < table[i].prob3) break;

		/* Decrement */
		value -= table[i].prob3;
	}

	return &r_info[table[i].index];
}